

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::ClearOneof
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  Cord *this_00;
  uint32_t number;
  CppStringType CVar1;
  FieldDescriptor *field;
  ulong uVar2;
  undefined8 *puVar3;
  long *plVar4;
  ArenaStringPtr *this_01;
  
  if ((oneof_descriptor->field_count_ == 1) && ((oneof_descriptor->fields_->field_0x1 & 2) != 0)) {
    ClearField(this,message,oneof_descriptor->fields_);
    return;
  }
  number = GetOneofCase(this,message,oneof_descriptor);
  if (number != 0) {
    field = Descriptor::FindFieldByNumber(this->descriptor_,number);
    uVar2 = (message->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    if (uVar2 == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
        VerifyFieldType<google::protobuf::Message*>(this,field);
        plVar4 = (long *)MutableRawImpl(this,message,field);
        if ((long *)*plVar4 != (long *)0x0) {
          (**(code **)(*(long *)*plVar4 + 8))();
        }
      }
      else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9) {
        CVar1 = FieldDescriptor::cpp_string_type(field);
        if ((CVar1 == kView) || (CVar1 == kString)) {
          this_01 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
          internal::ArenaStringPtr::Destroy(this_01);
        }
        else if (CVar1 == kCord) {
          VerifyFieldType<absl::lts_20250127::Cord*>(this,field);
          puVar3 = (undefined8 *)MutableRawImpl(this,message,field);
          this_00 = (Cord *)*puVar3;
          if (this_00 != (Cord *)0x0) {
            absl::lts_20250127::Cord::~Cord(this_00);
          }
          operator_delete(this_00,0x10);
        }
      }
    }
    if ((oneof_descriptor->field_count_ == 1) && ((oneof_descriptor->fields_->field_0x1 & 2) != 0))
    {
      ClearOneof();
    }
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                (long)oneof_descriptor->containing_type_->oneof_decls_) >> 3) *
                   -0x24924924 + (this->schema_).oneof_case_offset_)) = 0;
  }
  return;
}

Assistant:

void Reflection::ClearOneof(Message* message,
                            const OneofDescriptor* oneof_descriptor) const {
  if (oneof_descriptor->is_synthetic()) {
    ClearField(message, oneof_descriptor->field(0));
    return;
  }
  // TODO: Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32_t oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (message->GetArena() == nullptr) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              delete *MutableRaw<absl::Cord*>(message, field);
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsMicroString(field)) {
                MutableField<MicroString>(message, field)->Destroy();
              } else {
                // Oneof string fields are never set as a default instance.
                // We just need to pass some arbitrary default string to make it
                // work. This allows us to not have the real default accessible
                // from reflection.
                MutableField<ArenaStringPtr>(message, field)->Destroy();
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}